

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message_builder.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::java::MessageBuilderGenerator::GenerateIsInitialized
          (MessageBuilderGenerator *this,Printer *printer)

{
  int iVar1;
  long lVar2;
  ClassNameResolver *pCVar3;
  OneofDescriptor *oneof;
  bool bVar4;
  JavaType JVar5;
  Type TVar6;
  FieldGeneratorInfo *pFVar7;
  Descriptor *pDVar8;
  FieldDescriptor *pFVar9;
  LogMessage *other;
  OneofGeneratorInfo *value1;
  int i;
  long lVar10;
  undefined8 uVar11;
  _Alloc_hider _Var12;
  long lVar13;
  string local_b0;
  ClassNameResolver *local_90;
  string local_88;
  LogMessage local_68;
  
  io::Printer::Print(printer,"public final boolean isInitialized() {\n");
  io::Printer::Indent(printer);
  pDVar8 = this->descriptor_;
  if (0 < *(int *)(pDVar8 + 0x2c)) {
    lVar10 = 0;
    lVar13 = 0;
    do {
      lVar2 = *(long *)(pDVar8 + 0x30);
      pFVar7 = Context::GetFieldGeneratorInfo(this->context_,(FieldDescriptor *)(lVar10 + lVar2));
      if (*(int *)(lVar2 + 0x4c + lVar10) == 2) {
        io::Printer::Print(printer,"if (!has$name$()) {\n  return false;\n}\n","name",
                           &pFVar7->capitalized_name);
      }
      lVar13 = lVar13 + 1;
      pDVar8 = this->descriptor_;
      lVar10 = lVar10 + 0xa8;
    } while (lVar13 < *(int *)(pDVar8 + 0x2c));
  }
  pDVar8 = this->descriptor_;
  if (0 < *(int *)(pDVar8 + 0x2c)) {
    lVar13 = 0;
    lVar10 = 0;
    do {
      lVar2 = *(long *)(pDVar8 + 0x30);
      pFVar9 = (FieldDescriptor *)(lVar2 + lVar13);
      pFVar7 = Context::GetFieldGeneratorInfo(this->context_,pFVar9);
      JVar5 = GetJavaType(pFVar9);
      if (JVar5 == JAVATYPE_MESSAGE) {
        pDVar8 = FieldDescriptor::message_type(pFVar9);
        bVar4 = HasRequiredFields(pDVar8);
        if (bVar4) {
          iVar1 = *(int *)(lVar2 + 0x4c + lVar13);
          if (iVar1 == 1) {
            if ((*(int *)(*(long *)(this->descriptor_ + 0x10) + 0x8c) == 3) &&
               (oneof = *(OneofDescriptor **)(lVar2 + 0x60 + lVar13),
               oneof != (OneofDescriptor *)0x0)) {
              value1 = Context::GetOneofGeneratorInfo(this->context_,oneof);
              SimpleItoa_abi_cxx11_(&local_b0,(protobuf *)(ulong)*(uint *)(lVar2 + 0x38 + lVar13),i)
              ;
              io::Printer::Print(printer,"if ($oneof_name$Case_ == $field_number$) {\n","oneof_name"
                                 ,&value1->name,"field_number",&local_b0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
                operator_delete(local_b0._M_dataplus._M_p,
                                CONCAT26(local_b0.field_2._M_allocated_capacity._6_2_,
                                         CONCAT15(local_b0.field_2._M_local_buf[5],
                                                  CONCAT14(local_b0.field_2._M_local_buf[4],
                                                           local_b0.field_2._M_allocated_capacity.
                                                           _0_4_))) + 1);
              }
            }
            else {
              io::Printer::Print(printer,"if (has$name$()) {\n","name",&pFVar7->capitalized_name);
            }
            io::Printer::Print(printer,
                               "  if (!get$name$().isInitialized()) {\n    return false;\n  }\n}\n",
                               "name",&pFVar7->capitalized_name);
          }
          else if (iVar1 == 3) {
            pDVar8 = FieldDescriptor::message_type(pFVar9);
            if (*(char *)(*(long *)(pDVar8 + 0x20) + 0x6b) != '\x01') {
              pCVar3 = this->name_resolver_;
              pDVar8 = FieldDescriptor::message_type(pFVar9);
              ClassNameResolver::GetClassName_abi_cxx11_(&local_b0,pCVar3,pDVar8,true);
              io::Printer::Print(printer,
                                 "for (int i = 0; i < get$name$Count(); i++) {\n  if (!get$name$(i).isInitialized()) {\n    return false;\n  }\n}\n"
                                 ,"type",&local_b0,"name",&pFVar7->capitalized_name);
              goto LAB_00275652;
            }
            pDVar8 = FieldDescriptor::message_type(pFVar9);
            local_90 = this->name_resolver_;
            local_b0.field_2._M_local_buf[4] = 'e';
            local_b0.field_2._M_allocated_capacity._0_4_ = 0x756c6176;
            local_b0._M_string_length = 5;
            local_b0.field_2._M_local_buf[5] = '\0';
            local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
            pFVar9 = Descriptor::FindFieldByName(pDVar8,&local_b0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
              operator_delete(local_b0._M_dataplus._M_p,
                              CONCAT26(local_b0.field_2._M_allocated_capacity._6_2_,
                                       CONCAT15(local_b0.field_2._M_local_buf[5],
                                                CONCAT14(local_b0.field_2._M_local_buf[4],
                                                         local_b0.field_2._M_allocated_capacity.
                                                         _0_4_))) + 1);
            }
            TVar6 = FieldDescriptor::type(pFVar9);
            if (TVar6 != TYPE_MESSAGE) {
              internal::LogMessage::LogMessage
                        (&local_68,LOGLEVEL_DFATAL,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/compiler/java/java_message_builder.cc"
                         ,0x4a);
              other = internal::LogMessage::operator<<
                                (&local_68,
                                 "CHECK failed: (FieldDescriptor::TYPE_MESSAGE) == (value_field->type()): "
                                );
              internal::LogFinisher::operator=((LogFinisher *)&local_b0,other);
              internal::LogMessage::~LogMessage(&local_68);
            }
            pDVar8 = FieldDescriptor::message_type(pFVar9);
            ClassNameResolver::GetClassName_abi_cxx11_(&local_88,local_90,pDVar8,true);
            io::Printer::Print(printer,
                               "for ($type$ item : get$name$Map().values()) {\n  if (!item.isInitialized()) {\n    return false;\n  }\n}\n"
                               ,"type",&local_88,"name",&pFVar7->capitalized_name);
            uVar11 = local_88.field_2._M_allocated_capacity;
            _Var12._M_p = local_88._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_88._M_dataplus._M_p == &local_88.field_2) goto LAB_0027566e;
LAB_00275666:
            operator_delete(_Var12._M_p,uVar11 + 1);
          }
          else if (iVar1 == 2) {
            pCVar3 = this->name_resolver_;
            pDVar8 = FieldDescriptor::message_type(pFVar9);
            ClassNameResolver::GetClassName_abi_cxx11_(&local_b0,pCVar3,pDVar8,true);
            io::Printer::Print(printer,"if (!get$name$().isInitialized()) {\n  return false;\n}\n",
                               "type",&local_b0,"name",&pFVar7->capitalized_name);
LAB_00275652:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
              uVar11 = CONCAT26(local_b0.field_2._M_allocated_capacity._6_2_,
                                CONCAT15(local_b0.field_2._M_local_buf[5],
                                         CONCAT14(local_b0.field_2._M_local_buf[4],
                                                  local_b0.field_2._M_allocated_capacity._0_4_)));
              _Var12._M_p = local_b0._M_dataplus._M_p;
              goto LAB_00275666;
            }
          }
        }
      }
LAB_0027566e:
      lVar10 = lVar10 + 1;
      pDVar8 = this->descriptor_;
      lVar13 = lVar13 + 0xa8;
    } while (lVar10 < *(int *)(pDVar8 + 0x2c));
  }
  if (0 < *(int *)(pDVar8 + 0x68)) {
    io::Printer::Print(printer,"if (!extensionsAreInitialized()) {\n  return false;\n}\n");
  }
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"  return true;\n}\n\n");
  return;
}

Assistant:

void MessageBuilderGenerator::GenerateIsInitialized(
    io::Printer* printer) {
  printer->Print(
    "public final boolean isInitialized() {\n");
  printer->Indent();

  // Check that all required fields in this message are set.
  // TODO(kenton):  We can optimize this when we switch to putting all the
  //   "has" fields into a single bitfield.
  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldDescriptor* field = descriptor_->field(i);
    const FieldGeneratorInfo* info = context_->GetFieldGeneratorInfo(field);

    if (field->is_required()) {
      printer->Print(
        "if (!has$name$()) {\n"
        "  return false;\n"
        "}\n",
        "name", info->capitalized_name);
    }
  }

  // Now check that all embedded messages are initialized.
  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldDescriptor* field = descriptor_->field(i);
    const FieldGeneratorInfo* info = context_->GetFieldGeneratorInfo(field);
    if (GetJavaType(field) == JAVATYPE_MESSAGE &&
        HasRequiredFields(field->message_type())) {
      switch (field->label()) {
        case FieldDescriptor::LABEL_REQUIRED:
          printer->Print(
            "if (!get$name$().isInitialized()) {\n"
             "  return false;\n"
             "}\n",
            "type", name_resolver_->GetImmutableClassName(
                field->message_type()),
            "name", info->capitalized_name);
          break;
        case FieldDescriptor::LABEL_OPTIONAL:
          if (!SupportFieldPresence(descriptor_->file()) &&
              field->containing_oneof() != NULL) {
            const OneofDescriptor* oneof = field->containing_oneof();
            const OneofGeneratorInfo* oneof_info =
                context_->GetOneofGeneratorInfo(oneof);
            printer->Print(
              "if ($oneof_name$Case_ == $field_number$) {\n",
              "oneof_name", oneof_info->name,
              "field_number", SimpleItoa(field->number()));
          } else {
            printer->Print(
              "if (has$name$()) {\n",
              "name", info->capitalized_name);
          }
          printer->Print(
            "  if (!get$name$().isInitialized()) {\n"
            "    return false;\n"
            "  }\n"
            "}\n",
            "name", info->capitalized_name);
          break;
        case FieldDescriptor::LABEL_REPEATED:
          if (IsMapEntry(field->message_type())) {
            printer->Print(
              "for ($type$ item : get$name$Map().values()) {\n"
              "  if (!item.isInitialized()) {\n"
              "    return false;\n"
              "  }\n"
              "}\n",
              "type", MapValueImmutableClassdName(field->message_type(),
                                                  name_resolver_),
              "name", info->capitalized_name);
          } else {
            printer->Print(
              "for (int i = 0; i < get$name$Count(); i++) {\n"
              "  if (!get$name$(i).isInitialized()) {\n"
              "    return false;\n"
              "  }\n"
              "}\n",
              "type", name_resolver_->GetImmutableClassName(
                  field->message_type()),
              "name", info->capitalized_name);
          }
          break;
      }
    }
  }

  if (descriptor_->extension_range_count() > 0) {
    printer->Print(
      "if (!extensionsAreInitialized()) {\n"
      "  return false;\n"
      "}\n");
  }

  printer->Outdent();

  printer->Print(
    "  return true;\n"
    "}\n"
    "\n");
}